

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assume.h
# Opt level: O0

void pushback_reason_lazy<Engine::retrieve_assumption_nogood(vec<BoolView>&)::__0>
               (anon_class_1_0_00000001 *is_extractable,Lit p,vec<Lit> *out_nogood)

{
  Lit LVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  Lit *pLVar7;
  byte *pbVar8;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar9;
  vec<Lit> *this;
  Clause *this_00;
  SAT *this_01;
  vec<Lit> *in_RDX;
  int in_ESI;
  uint i_1;
  uint i;
  Lit q;
  uint j_1;
  Clause *c;
  uint j;
  Clause *expl;
  Lit p_2;
  int *index;
  vec<Lit> *ctrail;
  int lev;
  Reason last_reason;
  Lit p_1;
  uint jj;
  int pending;
  Clause *cp;
  vec<Lit> removed;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  uint in_stack_fffffffffffffe60;
  Lit in_stack_fffffffffffffe64;
  uint in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  SAT *in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  vec<Lit> *in_stack_fffffffffffffea8;
  uint local_fc;
  uint local_f4;
  uint local_e0;
  uint local_b0;
  uint local_78;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  int local_68;
  int local_64;
  Lit local_60;
  uint local_5c;
  int local_58;
  int local_48;
  int local_44;
  Clause *local_40;
  undefined4 local_38;
  int local_34;
  vec<Lit> local_30;
  int local_1c;
  vec<Lit> *local_18;
  Lit local_4;
  
  local_18 = in_RDX;
  local_4.x = in_ESI;
  local_1c = (int)operator~((Lit)0x281a48);
  vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                 (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  vec<Lit>::vec(&local_30);
  local_34 = local_4.x;
  uVar3 = var(local_4);
  piVar6 = vec<int>::operator[](&sat.trailpos,uVar3);
  if (*piVar6 < 0) {
    local_38 = 1;
  }
  else {
    local_48 = local_4.x;
    local_44 = (int)operator~((Lit)0x281acc);
    local_40 = SAT::getExpl((SAT *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (Lit)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    if (local_40 == (Clause *)0x0) {
      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                     (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_38 = 1;
    }
    else {
      local_58 = 0;
      for (local_5c = 1; uVar3 = local_5c, uVar4 = Clause::size(local_40), uVar3 < uVar4;
          local_5c = local_5c + 1) {
        pLVar7 = Clause::operator[]((Clause *)
                                    CONCAT44(in_stack_fffffffffffffe64.x,in_stack_fffffffffffffe60),
                                    in_stack_fffffffffffffe5c);
        local_64 = pLVar7->x;
        local_60.x = local_64;
        uVar3 = var((Lit)local_64);
        pbVar8 = (byte *)vec<char>::operator[](&sat.seen,uVar3);
        *pbVar8 = *pbVar8 | 1;
        local_68 = local_60.x;
        uVar3 = var(local_60);
        piVar6 = vec<int>::operator[](&sat.trailpos,uVar3);
        if (*piVar6 < 0) {
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                         (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        }
        else {
          local_58 = local_58 + 1;
        }
      }
      if (local_58 == 0) {
        local_38 = 1;
      }
      else {
        uVar3 = var(local_4);
        paVar9 = &vec<Reason>::operator[](&sat.reason,uVar3)->field_0;
        local_70 = *paVar9;
        local_78 = SAT::decisionLevel((SAT *)0x281cee);
        while (0 < (int)local_78) {
          this = vec<vec<Lit>_>::operator[](&sat.trail,local_78);
          sat.index = vec<Lit>::size(this);
          while (sat.index != 0) {
            sat.index = sat.index - 1;
            pLVar7 = vec<Lit>::operator[](this,sat.index);
            uVar3 = var((Lit)pLVar7->x);
            pbVar8 = (byte *)vec<char>::operator[](&sat.seen,uVar3);
            if ((*pbVar8 & 1) != 0) {
              pLVar7 = vec<Lit>::operator[](this,sat.index);
              LVar1.x = pLVar7->x;
              local_58 = local_58 + -1;
              iVar5 = Engine::retrieve_assumption_nogood::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                 in_stack_fffffffffffffe64);
              if (iVar5 == 0) {
                vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                               (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
                ;
                uVar3 = var(LVar1);
                paVar9 = &vec<Reason>::operator[](&sat.reason,uVar3)->field_0;
                bVar2 = Reason::operator==((Reason *)&local_70,(Reason)*paVar9);
                if (!bVar2) {
                  uVar3 = var(LVar1);
                  paVar9 = &vec<Reason>::operator[](&sat.reason,uVar3)->field_0;
                  local_70 = *paVar9;
                  this_01 = (SAT *)SAT::getExpl((SAT *)CONCAT44(in_stack_fffffffffffffea4,
                                                                in_stack_fffffffffffffea0),
                                                (Lit)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20)
                                               );
                  local_e0 = 1;
                  in_stack_fffffffffffffe70 = this_01;
                  while (in_stack_fffffffffffffe68 = local_e0,
                        in_stack_fffffffffffffe6c = Clause::size((Clause *)this_01),
                        in_stack_fffffffffffffe68 < in_stack_fffffffffffffe6c) {
                    pLVar7 = Clause::operator[]((Clause *)
                                                CONCAT44(in_stack_fffffffffffffe64.x,
                                                         in_stack_fffffffffffffe60),
                                                in_stack_fffffffffffffe5c);
                    LVar1.x = pLVar7->x;
                    uVar3 = var(LVar1);
                    pbVar8 = (byte *)vec<char>::operator[](&sat.seen,uVar3);
                    if ((*pbVar8 & 1) == 0) {
                      uVar3 = var(LVar1);
                      pbVar8 = (byte *)vec<char>::operator[](&sat.seen,uVar3);
                      *pbVar8 = *pbVar8 | 1;
                      uVar3 = var(LVar1);
                      piVar6 = vec<int>::operator[](&sat.trailpos,uVar3);
                      if (*piVar6 < 0) {
                        vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                                       (Lit *)CONCAT44(in_stack_fffffffffffffe6c,
                                                       in_stack_fffffffffffffe68));
                      }
                      else {
                        local_58 = local_58 + 1;
                      }
                    }
                    local_e0 = local_e0 + 1;
                  }
                }
              }
              else {
                this_00 = SAT::getExpl((SAT *)CONCAT44(in_stack_fffffffffffffea4,
                                                       in_stack_fffffffffffffea0),
                                       (Lit)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
                if (this_00 == (Clause *)0x0) {
                  in_stack_fffffffffffffea8 = local_18;
                  operator~((Lit)0x281eb0);
                  vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                                 (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ));
                }
                else {
                  local_b0 = 1;
                  while (in_stack_fffffffffffffea0 = local_b0,
                        in_stack_fffffffffffffea4 = Clause::size(this_00),
                        in_stack_fffffffffffffea0 < in_stack_fffffffffffffea4) {
                    pLVar7 = Clause::operator[]((Clause *)
                                                CONCAT44(in_stack_fffffffffffffe64.x,
                                                         in_stack_fffffffffffffe60),
                                                in_stack_fffffffffffffe5c);
                    uVar3 = var((Lit)pLVar7->x);
                    pbVar8 = (byte *)vec<char>::operator[](&sat.seen,uVar3);
                    if ((*pbVar8 & 1) == 0) {
                      operator~((Lit)0x281f83);
                      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                                     (Lit *)CONCAT44(in_stack_fffffffffffffe6c,
                                                     in_stack_fffffffffffffe68));
                      goto LAB_00281fdd;
                    }
                    local_b0 = local_b0 + 1;
                  }
                  vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe70,
                                 (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ));
                }
LAB_00281fdd:
                if (local_58 == 0) goto LAB_0028225e;
              }
            }
          }
          local_78 = local_78 - 1;
          SAT::btToLevel(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        }
LAB_0028225e:
        local_f4 = 0;
        while (in_stack_fffffffffffffe64.x = local_f4, uVar3 = vec<Lit>::size(&local_30),
              (uint)in_stack_fffffffffffffe64.x < uVar3) {
          pLVar7 = vec<Lit>::operator[](&local_30,local_f4);
          uVar3 = var((Lit)pLVar7->x);
          pbVar8 = (byte *)vec<char>::operator[](&sat.seen,uVar3);
          *pbVar8 = *pbVar8 & 0xfe;
          local_f4 = local_f4 + 1;
        }
        local_fc = 0;
        while (in_stack_fffffffffffffe60 = local_fc, uVar3 = vec<Lit>::size(local_18),
              in_stack_fffffffffffffe60 < uVar3) {
          pLVar7 = vec<Lit>::operator[](local_18,local_fc);
          uVar3 = var((Lit)pLVar7->x);
          pbVar8 = (byte *)vec<char>::operator[](&sat.seen,uVar3);
          *pbVar8 = *pbVar8 & 0xfe;
          local_fc = local_fc + 1;
        }
        local_38 = 0;
      }
    }
  }
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(in_stack_fffffffffffffe64.x,in_stack_fffffffffffffe60));
  return;
}

Assistant:

void pushback_reason_lazy(const Pred& is_extractable, Lit p, vec<Lit>& out_nogood) {
	assert(sat.value(p) == l_False);
	out_nogood.push(~p);
	// TODO: Take literal subsumption into account.
	// Even though we can't _export_ integer bounds, we can still
	// use the semantics to weaken the nogood.
	vec<Lit> removed;
	if (sat.trailpos[var(p)] < 0) {
		return;  // p is false at the root.
	}

	Clause* cp = sat.getExpl(~p);
	if (!cp) {
		// Somebody has pushed inconsistent assumptions.
		// * This may happen if, in an optimization problem, the user
		// * provided an objective lower bound which is achieved.

		// If p and ~p are assumptions, we just return a
		// tautological clause.
		out_nogood.push(p);
		return;
	}

	// There _should_ be at least one atom at the current decision level.
	int pending = 0;
	for (unsigned int jj = 1; jj < (*cp).size(); ++jj) {
		const Lit p((*cp)[jj]);
		assert(sat.value(p) == l_False);

		sat.seen[var(p)] |= 1;
		if (sat.trailpos[var(p)] < 0) {
			removed.push(p);  // If trailpos < 0, not needed.
		} else {
			pending++;
		}
	}
	assert(pending > 0);
	if (pending == 0) {
		return;
	}

	// Process the levels in order.
	Reason last_reason = sat.reason[var(p)];

	int lev = sat.decisionLevel();
	// Should never need to touch level 0.
	while (lev > 0) {
		vec<Lit>& ctrail = sat.trail[lev];

		int& index = sat.index;
		index = ctrail.size();
		while (index) {
			// Skip variables we haven't seen
			if (!(sat.seen[var(ctrail[--index])] & 1)) {
				continue;
			}

			// Found the next literal.
			const Lit p(ctrail[index]);
			pending--;

			assert(sat.value(p) == l_True);
			if (is_extractable(p)) {
				// p is an assumption.
				// See if we can drop it anyway.
				Clause* expl(sat.getExpl(p));
				if (!expl) {
					out_nogood.push(~p);
				} else {
					// If every antecedent is already seen, we don't need it.
					for (unsigned int j = 1; j < (*expl).size(); ++j) {
						if (!(sat.seen[var((*expl)[j])] & 1)) {
							// Needed after all
							out_nogood.push(~p);
							goto processed_assump;
						}
					}
					// Remember to reset seen at the end.
					removed.push(p);
				}
			processed_assump:
				// Have we seen enough?
				if (!pending) {
					goto pushback_finished;
				}
				continue;
			}

			// Not an assumption; mark the antecedents as seen.
			assert(var(p) >= 0 && var(p) < sat.nVars());

			// Sign doesn't really matter here; just the var.
			removed.push(p);

			if (last_reason == sat.reason[var(p)]) {
				continue;
			}
			last_reason = sat.reason[var(p)];

			Clause& c = *sat.getExpl(p);
			assert(&c);

			for (unsigned int j = 1; j < c.size(); j++) {
				const Lit q = c[j];
				if (!(sat.seen[var(q)] & 1)) {
					sat.seen[var(q)] |= 1;
					assert(sat.value(q) == l_False);
					assert(sat.trailpos[var(q)] <= static_cast<int>(engine.trail.size()));
					if (sat.trailpos[var(q)] < 0) {
						removed.push(q);
					} else {
						pending++;
					}
				}
			}
			assert(pending > 0);
		}
		// Finished at the current level.
		lev--;
		// We need to explicitly backtrack, because
		// getExpl calls btToPos, which accesses the _current_
		// decision level's trail.
		sat.btToLevel(lev);
	}

pushback_finished:
	assert(pending == 0);

	for (unsigned int i = 0; i < removed.size(); i++) {
		sat.seen[var(removed[i])] &= (~1);
	}
	for (unsigned int i = 0; i < out_nogood.size(); i++) {
		sat.seen[var(out_nogood[i])] &= (~1);
	}
}